

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O1

void __thiscall
estl::vector_s<std::__cxx11::string,10ul>::
assign<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (vector_s<std::__cxx11::string,10ul> *this,
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          first,__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                last)

{
  long *plVar1;
  long lVar2;
  size_type sVar3;
  long lVar4;
  
  sVar3 = check_range<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    (this,first,last);
  if (first._M_current != last._M_current) {
    lVar4 = 0;
    do {
      lVar2 = *(long *)(this + 0x148);
      plVar1 = (long *)(lVar2 + lVar4);
      *plVar1 = (long)(plVar1 + 2);
      plVar1 = (long *)((long)&((first._M_current)->_M_dataplus)._M_p + lVar4);
      std::__cxx11::string::_M_construct<char*>
                ((string *)(lVar2 + lVar4),*plVar1,plVar1[1] + *plVar1);
      lVar4 = lVar4 + 0x20;
    } while ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar1 + 4) !=
             last._M_current);
  }
  *(size_type *)this = sVar3;
  return;
}

Assistant:

void assign(InputIt first, InputIt last)
    {
        const size_type diff = check_range(first, last);
        size_type i = 0u;
        for (InputIt it = first; it != last; ++it, ++i) {
            const pointer insert_ptr = data_ptr_ + i;
            new (insert_ptr) value_type(*it);
        }
        size_ = diff;
    }